

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O1

bool spvtools::opt::anon_unknown_0::CompositeInsertToCompositeConstruct
               (IRContext *context,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  OperandList *this;
  _Rb_tree_header *p_Var1;
  IRContext *pIVar2;
  DefUseManager *pDVar3;
  iterator iVar4;
  pointer pOVar5;
  int *piVar6;
  vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *pvVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  int iVar10;
  array<signed_char,_4UL> aVar11;
  Operand *__cur;
  Instruction *pIVar12;
  size_t *psVar13;
  Type *pTVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar15;
  PodType aPVar16 [2];
  undefined4 extraout_var_02;
  uint uVar17;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var18;
  uint uVar19;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  InstructionBuilder ir_builder;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids_in_order;
  undefined1 local_e8 [8];
  undefined1 local_e0 [24];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Stack_c8;
  __aligned_membuf<std::pair<const_unsigned_int,_unsigned_int>_> local_c0;
  undefined1 local_b8 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_98;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_88;
  vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *local_50;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  
  if (inst->opcode_ != OpCompositeInsert) {
    __assert_fail("inst->opcode() == spv::Op::OpCompositeInsert && \"Wrong opcode.  Should be OpCompositeInsert.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x862,
                  "bool spvtools::opt::(anonymous namespace)::CompositeInsertToCompositeConstruct(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  uVar19 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar19 = (uint)inst->has_result_id_;
  }
  if ((int)((ulong)((long)(inst->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(inst->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar19 < 3
     ) {
    bVar23 = false;
  }
  else {
    pIVar2 = inst->context_;
    if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar2);
    }
    pDVar3 = (pIVar2->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    local_e0._0_8_ = (ulong)(uint)local_e0._4_4_ << 0x20;
    local_e0._8_8_ = (Instruction *)0x0;
    local_c0._M_storage[0] = '\0';
    local_c0._M_storage[1] = '\0';
    local_c0._M_storage[2] = '\0';
    local_c0._M_storage[3] = '\0';
    local_c0._M_storage[4] = '\0';
    local_c0._M_storage[5] = '\0';
    local_c0._M_storage[6] = '\0';
    local_c0._M_storage[7] = '\0';
    local_e0._16_8_ = local_e0;
    _Stack_c8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0;
    if (inst->opcode_ == OpCompositeInsert) {
      pIVar12 = inst;
      do {
        uVar19 = (pIVar12->has_result_id_ & 1) + 1;
        if (pIVar12->has_type_id_ == false) {
          uVar19 = (uint)pIVar12->has_result_id_;
        }
        uVar17 = (inst->has_result_id_ & 1) + 1;
        if (inst->has_type_id_ == false) {
          uVar17 = (uint)inst->has_result_id_;
        }
        uVar17 = (int)((ulong)((long)(inst->operands_).
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(inst->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
                 uVar17;
        if (uVar17 < (int)((ulong)((long)(pIVar12->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pIVar12->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x55555555 - uVar19) {
          uVar8 = Instruction::GetSingleWordOperand(pIVar12,(uVar19 + uVar17) - 1);
          _Var18._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0;
          for (iVar4.node_ = (Instruction *)local_e0._8_8_; iVar4.node_ != (Instruction *)0x0;
              iVar4.node_ = (Instruction *)
                            (&((_Rb_tree_node_base *)
                              &(iVar4.node_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>)->
                              _M_left)[bVar23]) {
            bVar23 = (uint)*(size_t *)
                            ((__aligned_membuf<std::pair<const_unsigned_int,_unsigned_int>_> *)
                            &(iVar4.node_)->context_)->_M_storage < uVar8;
            if (!bVar23) {
              _Var18._M_head_impl =
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)iVar4.node_;
            }
          }
          _Var20._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0;
          if ((_Var18._M_head_impl !=
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0) &&
             (_Var20._M_head_impl = _Var18._M_head_impl,
             uVar8 < *(uint *)((long)(_Var18._M_head_impl + 1) + 8))) {
            _Var20._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0;
          }
          if (_Var20._M_head_impl == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0
             ) {
            local_88._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_88._M_impl.super__Rb_tree_header._M_header;
            local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_88._M_impl.super__Rb_tree_header._M_node_count._0_1_ = '\0';
            local_88._M_impl.super__Rb_tree_header._M_node_count._1_1_ = '\0';
            local_88._M_impl.super__Rb_tree_header._M_node_count._2_1_ = '\0';
            local_88._M_impl.super__Rb_tree_header._M_node_count._3_1_ = '\0';
            local_88._M_impl.super__Rb_tree_header._M_node_count._4_1_ = '\0';
            local_88._M_impl.super__Rb_tree_header._M_node_count._5_1_ = '\0';
            local_88._M_impl.super__Rb_tree_header._M_node_count._6_1_ = '\0';
            local_88._M_impl.super__Rb_tree_header._M_node_count._7_1_ = '\0';
            local_88._M_impl._0_4_ = 0;
            local_88._M_impl._4_4_ = 0;
            local_88._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
            psVar13 = &local_88._M_impl.super__Rb_tree_header._M_node_count;
            local_88._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_88._M_impl.super__Rb_tree_header._M_header._M_left;
            goto LAB_005b3627;
          }
        }
        bVar23 = HaveSameIndexesExceptForLast(inst,pIVar12);
        if (bVar23) {
          uVar9 = Instruction::GetSingleWordOperand
                            (pIVar12,(int)((ulong)((long)(pIVar12->operands_).
                                                                                                                  
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pIVar12->operands_).
                                                                                                                
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                                     -0x55555555 - 1);
          uVar8 = (pIVar12->has_result_id_ & 1) + 1;
          if (pIVar12->has_type_id_ == false) {
            uVar8 = (uint)pIVar12->has_result_id_;
          }
          local_88._M_impl._4_4_ = Instruction::GetSingleWordOperand(pIVar12,uVar8);
          local_88._M_impl._0_4_ = uVar9;
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
          ::_M_insert_unique<std::pair<unsigned_int_const,unsigned_int>>
                    ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                      *)local_e8,(pair<const_unsigned_int,_unsigned_int> *)&local_88);
        }
        uVar19 = (pIVar12->has_result_id_ & 1) + 1;
        if (pIVar12->has_type_id_ == false) {
          uVar19 = (uint)pIVar12->has_result_id_;
        }
        uVar8 = Instruction::GetSingleWordOperand(pIVar12,uVar19 + 1);
        pIVar12 = analysis::DefUseManager::GetDef(pDVar3,uVar8);
      } while (pIVar12->opcode_ == OpCompositeInsert);
    }
    p_Var1 = &local_88._M_impl.super__Rb_tree_header;
    if ((Instruction *)local_e0._8_8_ == (Instruction *)0x0) {
      psVar13 = &local_88._M_impl.super__Rb_tree_header._M_node_count;
      local_88._M_impl.super__Rb_tree_header._M_header._0_8_ =
           (ulong)(uint)local_88._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
      local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    else {
      psVar13 = (size_t *)&local_c0;
      local_88._M_impl.super__Rb_tree_header._M_header._M_color = local_e0._0_4_;
      local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_e0._8_8_;
      local_88._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_e0._16_8_;
      local_88._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)_Stack_c8._M_head_impl;
      ((_Rb_tree_node_base *)local_e0._8_8_)->_M_parent = &p_Var1->_M_header;
      local_88._M_impl.super__Rb_tree_header._M_node_count._0_1_ = local_c0._M_storage[0];
      local_88._M_impl.super__Rb_tree_header._M_node_count._1_1_ = local_c0._M_storage[1];
      local_88._M_impl.super__Rb_tree_header._M_node_count._2_1_ = local_c0._M_storage[2];
      local_88._M_impl.super__Rb_tree_header._M_node_count._3_1_ = local_c0._M_storage[3];
      local_88._M_impl.super__Rb_tree_header._M_node_count._4_1_ = local_c0._M_storage[4];
      local_88._M_impl.super__Rb_tree_header._M_node_count._5_1_ = local_c0._M_storage[5];
      local_88._M_impl.super__Rb_tree_header._M_node_count._6_1_ = local_c0._M_storage[6];
      local_88._M_impl.super__Rb_tree_header._M_node_count._7_1_ = local_c0._M_storage[7];
      local_e0._8_8_ = (Instruction *)0x0;
      local_e0._16_8_ = local_e0;
      _Stack_c8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0;
    }
LAB_005b3627:
    *psVar13 = 0;
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::_M_erase((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                *)local_e8,(_Link_type)local_e0._8_8_);
    if (inst->opcode_ != OpCompositeInsert) {
      __assert_fail("inst->opcode() == spv::Op::OpCompositeInsert",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                    ,0x833,
                    "uint32_t spvtools::opt::(anonymous namespace)::GetContainerTypeId(Instruction *)"
                   );
    }
    pIVar2 = inst->context_;
    if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar2);
    }
    pDVar3 = (pIVar2->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    uVar8 = 0;
    if (inst->has_type_id_ == true) {
      uVar8 = Instruction::GetSingleWordOperand(inst,0);
    }
    uVar8 = GetElementType(uVar8,(inst->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 4,
                           (inst->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1,pDVar3);
    if (uVar8 == 0) {
      bVar23 = false;
    }
    else {
      if ((context->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
        IRContext::BuildTypeManager(context);
      }
      pTVar14 = analysis::TypeManager::GetType
                          ((context->type_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                           .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                           _M_head_impl,uVar8);
      if (pTVar14 == (Type *)0x0) {
        __assert_fail("container_type && \"GetContainerTypeId returned a bad id.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                      ,0x86d,
                      "bool spvtools::opt::(anonymous namespace)::CompositeInsertToCompositeConstruct(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                     );
      }
      iVar10 = (*pTVar14->_vptr_Type[0xe])(pTVar14);
      if (CONCAT44(extraout_var,iVar10) == 0) {
        iVar10 = (*pTVar14->_vptr_Type[0x10])(pTVar14);
        if (CONCAT44(extraout_var_00,iVar10) == 0) {
          iVar10 = (*pTVar14->_vptr_Type[0x1e])(pTVar14);
          lVar15 = CONCAT44(extraout_var_01,iVar10);
          if (lVar15 == 0) {
            iVar10 = (*pTVar14->_vptr_Type[0x18])(pTVar14);
            lVar15 = CONCAT44(extraout_var_02,iVar10);
            if (lVar15 == 0) {
              uVar22 = 0;
            }
            else {
              piVar6 = *(int **)(lVar15 + 0x38);
              uVar22 = 0xffffffff;
              if ((*piVar6 == 0) && (*(long *)(lVar15 + 0x40) - (long)piVar6 == 8)) {
                uVar22 = (ulong)(uint)piVar6[1];
              }
            }
          }
          else {
            uVar22 = (ulong)(*(long *)(lVar15 + 0x30) - *(long *)(lVar15 + 0x28)) >> 3;
          }
        }
        else {
          uVar22 = (ulong)*(uint *)(CONCAT44(extraout_var_00,iVar10) + 0x30);
        }
      }
      else {
        uVar22 = (ulong)*(uint *)(CONCAT44(extraout_var,iVar10) + 0x30);
      }
      if (local_88._M_impl.super__Rb_tree_header._M_node_count == (uVar22 & 0xffffffff)) {
        lVar15 = std::_Rb_tree_decrement(&local_88._M_impl.super__Rb_tree_header._M_header);
        bVar23 = *(uint *)(lVar15 + 0x20) < (uint)uVar22;
      }
      else {
        bVar23 = false;
      }
      if (bVar23) {
        pIVar2 = inst->context_;
        local_e0._0_8_ = IRContext::get_instr_block(pIVar2,inst);
        local_e0._16_4_ = (array<signed_char,_4UL>)0x3;
        local_b8._0_8_ = (_func_int **)0x0;
        local_b8._8_8_ = (uint *)0x0;
        local_b8._16_4_ = (array<signed_char,_4UL>)0x0;
        local_b8._20_4_ = (array<signed_char,_4UL>)0x0;
        p_Var1 = &local_88._M_impl.super__Rb_tree_header;
        local_e8 = (undefined1  [8])pIVar2;
        local_e0._8_8_ = inst;
        if ((_Rb_tree_header *)local_88._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
          aPVar16 = (PodType  [2])local_88._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            local_48.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_start = *(pointer *)((long)aPVar16 + 0x20);
            if (local_b8._8_8_ == local_b8._16_8_) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_b8,
                         (iterator)local_b8._8_8_,
                         (uint *)((long)&local_48.
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 4));
            }
            else {
              local_48.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_start._4_4_ =
                   (uint)((ulong)local_48.
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 0x20);
              *(uint *)local_b8._8_8_ =
                   local_48.
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_;
              local_b8._8_8_ = local_b8._8_8_ + 4;
            }
            aPVar16 = (PodType  [2])std::_Rb_tree_increment((_Rb_tree_node_base *)aPVar16);
          } while (aPVar16 != (PodType  [2])p_Var1);
        }
        pIVar12 = InstructionBuilder::AddCompositeConstruct
                            ((InstructionBuilder *)local_e8,uVar8,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8);
        if ((_func_int **)local_b8._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
        }
        this = &inst->operands_;
        uVar19 = (inst->has_result_id_ & 1) + 1;
        if (inst->has_type_id_ == false) {
          uVar19 = (uint)inst->has_result_id_;
        }
        if ((int)((ulong)((long)(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(inst->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
            uVar19 == 3) {
          inst->opcode_ = OpCopyObject;
          aVar11._M_elems[0] = '\0';
          aVar11._M_elems[1] = '\0';
          aVar11._M_elems[2] = '\0';
          aVar11._M_elems[3] = '\0';
          local_50 = (vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)this;
          if (pIVar12->has_result_id_ == true) {
            aVar11._M_elems =
                 (_Type)Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
          }
          local_b8._24_8_ = local_b8 + 0x10;
          local_b8._0_8_ = &PTR__SmallVector_009488e0;
          local_98._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_b8._16_4_ = aVar11._M_elems;
          local_b8._8_8_ = (uint *)0x1;
          local_e8._0_4_ = 1;
          local_e0._0_8_ = &PTR__SmallVector_009488e0;
          local_e0._8_8_ = (Instruction *)0x0;
          _Stack_c8._M_head_impl =
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)local_e0 + 0x10);
          local_c0._M_storage[0] = '\0';
          local_c0._M_storage[1] = '\0';
          local_c0._M_storage[2] = '\0';
          local_c0._M_storage[3] = '\0';
          local_c0._M_storage[4] = '\0';
          local_c0._M_storage[5] = '\0';
          local_c0._M_storage[6] = '\0';
          local_c0._M_storage[7] = '\0';
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)local_e0,
                     (SmallVector<unsigned_int,_2UL> *)local_b8);
          local_48.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_48.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_48.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
          pOVar5 = local_48.
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
          (local_48.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start)->type = local_e8._0_4_;
          ((local_48.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_start)->words)._vptr_SmallVector =
               (_func_int **)&PTR__SmallVector_009488e0;
          ((local_48.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_start)->words).size_ = 0;
          ((local_48.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_start)->words).small_data_ =
               (uint *)((local_48.
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start)->words).buffer;
          ((local_48.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_start)->words).large_data_._M_t.
          super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_48.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar5;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    (&(local_48.
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start)->words,
                     (SmallVector<unsigned_int,_2UL> *)local_e0);
          pvVar7 = local_50;
          uVar19 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar19 = (uint)inst->has_result_id_;
          }
          local_48.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_finish = pOVar5;
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                     local_50,(Operand *)
                              ((long)((((inst->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->words).buffer +
                                     -6) + (ulong)(uVar19 * 0x30)),
                     (inst->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                    (pvVar7,(inst->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                     local_48.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_48.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    (&local_48);
          local_e0._0_8_ = &PTR__SmallVector_009488e0;
          if (local_c0._M_storage != (uchar  [8])0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_c0,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0._M_storage);
          }
          local_c0._M_storage[0] = '\0';
          local_c0._M_storage[1] = '\0';
          local_c0._M_storage[2] = '\0';
          local_c0._M_storage[3] = '\0';
          local_c0._M_storage[4] = '\0';
          local_c0._M_storage[5] = '\0';
          local_c0._M_storage[6] = '\0';
          local_c0._M_storage[7] = '\0';
          local_b8._0_8_ = &PTR__SmallVector_009488e0;
          if (local_98._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_98,local_98._M_head_impl);
          }
        }
        else {
          uVar8 = 0;
          if (pIVar12->has_result_id_ == true) {
            uVar8 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
          }
          local_e0._16_8_ = (long)local_e0 + 8;
          local_e8 = (undefined1  [8])&PTR__SmallVector_009488e0;
          _Stack_c8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_e0._8_4_ = uVar8;
          local_e0._0_8_ = (BasicBlock *)0x1;
          uVar22 = (ulong)(inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar22 = (ulong)inst->has_result_id_;
          }
          pOVar5 = (inst->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar21 = ((long)(inst->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar5 >> 4) *
                   -0x5555555555555555;
          if (uVar21 < uVar22 || uVar21 - uVar22 == 0) {
            __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0x2b8,
                          "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                         );
          }
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)
                     ((long)&((OperandData *)((pOVar5->words).buffer + -4))->_vptr_SmallVector +
                     (ulong)(uint)((int)uVar22 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_e8);
          local_e8 = (undefined1  [8])&PTR__SmallVector_009488e0;
          if ((PodType  [2])_Stack_c8._M_head_impl != (PodType  [2])0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &_Stack_c8,_Stack_c8._M_head_impl);
          }
          pOVar5 = (inst->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                    (this,pOVar5 + ((int)((ulong)((long)(inst->operands_).
                                                                                                                
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                 (long)pOVar5) >> 4) * -0x55555555 - 1));
        }
      }
    }
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::_M_erase(&local_88,(_Link_type)local_88._M_impl.super__Rb_tree_header._M_header._M_parent);
  }
  return bVar23;
}

Assistant:

bool CompositeInsertToCompositeConstruct(
    IRContext* context, Instruction* inst,
    const std::vector<const analysis::Constant*>&) {
  assert(inst->opcode() == spv::Op::OpCompositeInsert &&
         "Wrong opcode.  Should be OpCompositeInsert.");
  if (inst->NumInOperands() < 3) return false;

  std::map<uint32_t, uint32_t> values_inserted = GetInsertedValues(inst);
  uint32_t container_type_id = GetContainerTypeId(inst);
  if (container_type_id == 0) {
    return false;
  }

  analysis::TypeManager* type_mgr = context->get_type_mgr();
  const analysis::Type* container_type = type_mgr->GetType(container_type_id);
  assert(container_type && "GetContainerTypeId returned a bad id.");
  if (!DoInsertedValuesCoverEntireObject(container_type, values_inserted)) {
    return false;
  }

  Instruction* construct =
      BuildCompositeConstruct(container_type_id, values_inserted, inst);
  InsertConstructedObject(inst, construct);
  return true;
}